

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O1

RTPAddress * __thiscall
jrtplib::RTPIPv4Address::CreateCopy(RTPIPv4Address *this,RTPMemoryManager *mgr)

{
  undefined2 uVar1;
  undefined4 uVar2;
  RTPAddress *pRVar3;
  
  if (mgr == (RTPMemoryManager *)0x0) {
    pRVar3 = (RTPAddress *)operator_new(0x18);
  }
  else {
    pRVar3 = (RTPAddress *)(**(code **)(*(long *)mgr + 0x10))(mgr,0x18,0x17);
  }
  uVar2 = *(undefined4 *)&(this->super_RTPAddress).field_0xc;
  uVar1 = this->port;
  pRVar3->addresstype = IPv4Address;
  pRVar3->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013bb80;
  *(undefined4 *)&pRVar3->field_0xc = uVar2;
  *(undefined2 *)&pRVar3[1]._vptr_RTPAddress = uVar1;
  *(short *)((long)&pRVar3[1]._vptr_RTPAddress + 2) = uVar1 + 1;
  return pRVar3;
}

Assistant:

RTPAddress *RTPIPv4Address::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPIPv4Address *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv4Address(ip,port);
	return a;
}